

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

Debug * Corrade::Utility::operator<<(Debug *debug,Type value)

{
  Debug *pDVar1;
  Type value_local;
  Debug *debug_local;
  
  pDVar1 = Debug::operator<<(debug,"Utility::JsonToken::Type");
  Debug::operator<<(pDVar1,Debug::nospace);
  if (value == Number) {
    debug_local = Debug::operator<<(debug,"::Number");
  }
  else if (value == String) {
    debug_local = Debug::operator<<(debug,"::String");
  }
  else if (value == Object) {
    debug_local = Debug::operator<<(debug,"::Object");
  }
  else if (value == Array) {
    debug_local = Debug::operator<<(debug,"::Array");
  }
  else if (value == Null) {
    debug_local = Debug::operator<<(debug,"::Null");
  }
  else {
    pDVar1 = Debug::operator<<(debug,"(");
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    pDVar1 = Debug::operator<<(pDVar1,Debug::hex);
    pDVar1 = Debug::operator<<(pDVar1,value);
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    debug_local = Debug::operator<<(pDVar1,")");
  }
  return debug_local;
}

Assistant:

Debug& operator<<(Debug& debug, const JsonToken::Type value) {
    debug << "Utility::JsonToken::Type" << Debug::nospace;

    switch(value) {
        /* LCOV_EXCL_START */
        #define _c(v) case JsonToken::Type::v: return debug << "::" #v;
        _c(Object)
        _c(Array)
        _c(Null)
        _c(Bool)
        _c(Number)
        _c(String)
        #undef _c
        /* LCOV_EXCL_STOP */
    }

    return debug << "(" << Debug::nospace << Debug::hex << std::uint64_t(value) << Debug::nospace << ")";
}